

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O2

sat_solver * Pdr_ManCreateSolver(Pdr_Man_t *p,int k)

{
  Vec_Ptr_t *pVVar1;
  uint __line;
  sat_solver *psVar2;
  void *pvVar3;
  Aig_Obj_t *pObj;
  int iVar4;
  long lVar5;
  int nCapMin;
  char *__assertion;
  
  if (p->vSolvers->nSize == k) {
    if (p->vClauses->nSize == k) {
      if (p->vActVars->nSize == k) {
        psVar2 = sat_solver_new();
        psVar2 = Pdr_ManNewSolver(psVar2,p,k,(uint)(k == 0));
        pVVar1 = p->vSolvers;
        iVar4 = pVVar1->nSize;
        if (iVar4 == pVVar1->nCap) {
          nCapMin = 0x10;
          if (0xf < iVar4) {
            nCapMin = iVar4 * 2;
          }
          Vec_PtrGrow(pVVar1,nCapMin);
          iVar4 = pVVar1->nSize;
        }
        pVVar1->nSize = iVar4 + 1;
        pVVar1->pArray[iVar4] = psVar2;
        pVVar1 = (Vec_Ptr_t *)p->vClauses;
        if (pVVar1->nSize <= k) {
          Vec_PtrGrow(pVVar1,k + 1);
          for (lVar5 = (long)pVVar1->nSize; lVar5 <= k; lVar5 = lVar5 + 1) {
            pvVar3 = calloc(1,0x10);
            pVVar1->pArray[lVar5] = pvVar3;
          }
          pVVar1->nSize = k + 1;
        }
        Vec_IntPush(p->vActVars,0);
        for (iVar4 = 0; iVar4 < p->pAig->nTruePos; iVar4 = iVar4 + 1) {
          pObj = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,iVar4);
          Pdr_ObjSatVar(p,k,1,pObj);
        }
        return psVar2;
      }
      __assertion = "Vec_IntSize(p->vActVars) == k";
      __line = 0x34;
    }
    else {
      __assertion = "Vec_VecSize(p->vClauses) == k";
      __line = 0x33;
    }
  }
  else {
    __assertion = "Vec_PtrSize(p->vSolvers) == k";
    __line = 0x32;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/pdr/pdrSat.c"
                ,__line,"sat_solver *Pdr_ManCreateSolver(Pdr_Man_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Creates new SAT solver.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
sat_solver * Pdr_ManCreateSolver( Pdr_Man_t * p, int k )
{
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int i;
    assert( Vec_PtrSize(p->vSolvers) == k );
    assert( Vec_VecSize(p->vClauses) == k );
    assert( Vec_IntSize(p->vActVars) == k );
    // create new solver
    pSat = sat_solver_new();
    pSat = Pdr_ManNewSolver( pSat, p, k, (int)(k == 0) );
    Vec_PtrPush( p->vSolvers, pSat );
    Vec_VecExpand( p->vClauses, k );
    Vec_IntPush( p->vActVars, 0 );
    // add property cone
    Saig_ManForEachPo( p->pAig, pObj, i )
        Pdr_ObjSatVar( p, k, 1, pObj );
    return pSat;
}